

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void pcache1Truncate(sqlite3_pcache *p,uint iLimit)

{
  PCache1 *pCache;
  
  if (iLimit <= *(uint *)(p + 0x2c)) {
    pcache1TruncateUnsafe((PCache1 *)p,iLimit);
    *(uint *)(p + 0x2c) = iLimit - 1;
  }
  return;
}

Assistant:

static void pcache1Truncate(sqlite3_pcache *p, unsigned int iLimit){
  PCache1 *pCache = (PCache1 *)p;
  pcache1EnterMutex(pCache->pGroup);
  if( iLimit<=pCache->iMaxKey ){
    pcache1TruncateUnsafe(pCache, iLimit);
    pCache->iMaxKey = iLimit-1;
  }
  pcache1LeaveMutex(pCache->pGroup);
}